

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::generateComputeShader
                   (string *__return_storage_ptr__,NegativeTestContext *ctx,
                   string *shaderDeclarations,string *shaderBody)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  ostringstream compShaderSource;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&compShaderSource);
  poVar3 = std::operator<<((ostream *)&compShaderSource,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar3 = std::operator<<(poVar3,(string *)shaderDeclarations);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,(string *)shaderBody);
  std::operator<<(poVar3,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&compShaderSource);
  return __return_storage_ptr__;
}

Assistant:

string generateComputeShader (NegativeTestContext& ctx, const string& shaderDeclarations, const string& shaderBody)
{
	const bool			isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const char* const	shaderVersion	= isES32
										? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES)
										: getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	std::ostringstream compShaderSource;

	compShaderSource	<<	shaderVersion << "\n"
						<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
						<<	shaderDeclarations << "\n"
						<<	"void main (void)\n"
						<<	"{\n"
						<<	shaderBody
						<<	"}\n";

	return compShaderSource.str();
}